

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_transform.c
# Opt level: O3

void gdImageFlipHorizontal(gdImagePtr im)

{
  uchar uVar1;
  int **ppiVar2;
  int *piVar3;
  uchar *puVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uchar *puVar8;
  int *piVar9;
  long lVar10;
  
  iVar5 = im->sy;
  if (im->trueColor == 0) {
    if (0 < iVar5) {
      uVar7 = im->sx;
      lVar6 = 0;
      do {
        if (1 < (int)uVar7) {
          puVar4 = im->pixels[lVar6];
          puVar8 = puVar4 + uVar7;
          lVar10 = 0;
          do {
            puVar8 = puVar8 + -1;
            uVar1 = puVar4[lVar10];
            puVar4[lVar10] = *puVar8;
            *puVar8 = uVar1;
            uVar7 = im->sx;
            lVar10 = lVar10 + 1;
          } while ((int)lVar10 < (int)uVar7 >> 1);
          iVar5 = im->sy;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar5);
    }
  }
  else if (0 < iVar5) {
    ppiVar2 = im->tpixels;
    uVar7 = im->sx;
    lVar6 = 0;
    do {
      if (1 < (int)uVar7) {
        piVar3 = ppiVar2[lVar6];
        piVar9 = piVar3 + uVar7;
        lVar10 = 0;
        do {
          piVar9 = piVar9 + -1;
          iVar5 = piVar3[lVar10];
          piVar3[lVar10] = *piVar9;
          *piVar9 = iVar5;
          uVar7 = im->sx;
          lVar10 = lVar10 + 1;
        } while ((int)lVar10 < (int)uVar7 >> 1);
        iVar5 = im->sy;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFlipHorizontal(gdImagePtr im)
{

	int x, y;

	if (im->trueColor) {
		int *px1, *px2, tmp;

		for (y = 0; y < im->sy; y++) {
			px1 = im->tpixels[y];
			px2 = im->tpixels[y] + im->sx - 1;
			for (x = 0; x < (im->sx >> 1); x++) {
				tmp = *px1;
				*px1 = *px2;
				*px2 = tmp;
				px1++;
				px2--;
			}
		}
	} else {
		unsigned char *px1, *px2, tmp;

		for (y = 0; y < im->sy; y++) {
			px1 = im->pixels[y];
			px2 = im->pixels[y] + im->sx - 1;
			for (x = 0; x < (im->sx >> 1); x++) {
				tmp = *px1;
				*px1 = *px2;
				*px2 = tmp;
				px1++;
				px2--;
			}
		}
	}
}